

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O1

void cave_known(player *p)

{
  _Bool _Var1;
  loc grid;
  loc grid_00;
  square *psVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long local_48;
  
  if (0 < cave->height) {
    local_48 = 0;
    do {
      if (0 < cave->width) {
        lVar4 = 0;
        do {
          grid = (loc)loc((int)lVar4,(int)local_48);
          lVar3 = 0;
          iVar5 = 0;
          do {
            grid_00 = (loc)loc_sum((loc_conflict)grid,(loc_conflict)ddgrid_ddd[lVar3]);
            _Var1 = square_isprojectable(cave,grid_00);
            if (_Var1) {
              _Var1 = square_isbright(cave,grid_00);
              if (_Var1) goto LAB_00127b17;
            }
            else {
LAB_00127b17:
              iVar5 = iVar5 + 1;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 8);
          if (iVar5 < 8) {
            psVar2 = square(cave,grid);
            p->cave->squares[local_48][lVar4].feat = psVar2->feat;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < cave->width);
      }
      local_48 = local_48 + 1;
    } while (local_48 < cave->height);
  }
  return;
}

Assistant:

void cave_known(struct player *p)
{
	int y, x;
	for (y = 0; y < cave->height; y++) {
		for (x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			int d;
			int count = 0;

			/* Check around the grid */
			for (d = 0; d < 8; d++) {
				/* Extract adjacent location */
				struct loc adj_grid = loc_sum(grid, ddgrid_ddd[d]);

				/* Don't count projectable or lava squares */
				if (!square_isprojectable(cave, adj_grid) ||
					square_isbright(cave, adj_grid))
					++count;
			}

			/* Internal walls not known */
			if (count < 8) {
				p->cave->squares[y][x].feat = square(cave, grid)->feat;
			}
		}
	}
}